

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O3

void addToDecreasingHeap(HighsInt *n,HighsInt mx_n,vector<double,_std::allocator<double>_> *heap_v,
                        vector<int,_std::allocator<int>_> *heap_ix,double v,HighsInt ix)

{
  ulong uVar1;
  pointer piVar2;
  long lVar3;
  pointer pdVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  iVar6 = *n;
  if (iVar6 < mx_n) {
    uVar7 = iVar6 + 1;
    uVar5 = (ulong)uVar7;
    *n = uVar7;
    pdVar4 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < iVar6) {
      do {
        uVar9 = (uint)uVar5;
        uVar1 = uVar5 >> 1;
        uVar7 = uVar9;
        if (pdVar4[uVar1] <= v) break;
        pdVar4[uVar5] = pdVar4[uVar1];
        piVar2[uVar5] = piVar2[uVar1];
        uVar5 = uVar1;
        uVar7 = (uint)uVar1;
      } while (3 < uVar9);
    }
    lVar3 = (long)(int)uVar7;
  }
  else {
    pdVar4 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (v < pdVar4[1] || v == pdVar4[1]) goto LAB_00379585;
    lVar3 = 1;
    if (1 < iVar6) {
      uVar7 = 2;
      uVar9 = 1;
      do {
        lVar3 = (long)(int)uVar7;
        uVar8 = uVar7;
        if ((int)uVar7 < iVar6) {
          uVar7 = uVar7 | 1;
          if (pdVar4[(int)uVar7] <= pdVar4[lVar3] && pdVar4[lVar3] != pdVar4[(int)uVar7]) {
            lVar3 = (long)(int)uVar7;
            uVar8 = uVar7;
          }
        }
        if (v <= pdVar4[lVar3]) break;
        pdVar4[(int)uVar9] = pdVar4[lVar3];
        piVar2[(int)uVar9] = piVar2[lVar3];
        uVar7 = uVar8 * 2;
        iVar6 = *n;
        uVar9 = uVar8;
      } while ((int)uVar7 <= iVar6);
      lVar3 = (long)(int)uVar9;
    }
  }
  pdVar4[lVar3] = v;
  piVar2[lVar3] = ix;
LAB_00379585:
  *piVar2 = 1;
  return;
}

Assistant:

void addToDecreasingHeap(HighsInt& n, HighsInt mx_n, vector<double>& heap_v,
                         vector<HighsInt>& heap_ix, const double v,
                         const HighsInt ix) {
  HighsInt cd_p, pa_p;
  if (n < mx_n) {
    // The heap is not full so put the new value at the bottom of the
    // heap and let it rise up to its correct level.
    n++;
    cd_p = n;
    pa_p = cd_p / 2;
    for (;;) {
      if (pa_p > 0) {
        if (v < heap_v[pa_p]) {
          heap_v[cd_p] = heap_v[pa_p];
          heap_ix[cd_p] = heap_ix[pa_p];
          cd_p = pa_p;
          pa_p = pa_p / 2;
          continue;
        }
      }
      break;
    }
    heap_v[cd_p] = v;
    heap_ix[cd_p] = ix;
  } else if (v > heap_v[1]) {
    // The heap is full so replace the least value with the new value
    // and let it sink down to its correct level.
    pa_p = 1;
    cd_p = pa_p + pa_p;
    for (;;) {
      if (cd_p <= n) {
        if (cd_p < n) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p++;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  // Set heap_ix[0]=1 to indicate that the values form a heap.
  heap_ix[0] = 1;
  return;
}